

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O3

tHalfEdge __thiscall MeshLib::Solid::vertexHalfedge(Solid *this,tVertex v0,tVertex v1)

{
  tEdge pEVar1;
  HalfEdge *pHVar2;
  TopologyException *this_00;
  
  pEVar1 = vertexEdge(this,v0,v1);
  pHVar2 = pEVar1->m_halfedge[0];
  if (((pHVar2->m_vertex != v1) || (pHVar2->m_prev->m_vertex != v0)) &&
     ((pHVar2 = pEVar1->m_halfedge[1], pHVar2->m_vertex != v1 || (pHVar2->m_prev->m_vertex != v0))))
  {
    this_00 = (TopologyException *)__cxa_allocate_exception(8);
    TopologyException::TopologyException(this_00);
    __cxa_throw(this_00,&TopologyException::typeinfo,TopologyException::~TopologyException);
  }
  return pHVar2;
}

Assistant:

Solid::tHalfEdge Solid::vertexHalfedge( tVertex v0, tVertex v1 )
{
	tEdge e = vertexEdge( v0, v1 );
	tHalfEdge he = e->halfedge(0);
	if( he->vertex() == v1 && he->he_prev()->vertex() == v0 ) return he;
	he = e->halfedge(1);
	if( he->vertex() != v1 || he->he_prev()->vertex() != v0 ) throw TopologyException();
	return he;
}